

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

uint16 * __thiscall
Js::FunctionExecutionStateMachine::GetStateLimit
          (FunctionExecutionStateMachine *this,ExecutionState state)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ExecutionState state_local;
  FunctionExecutionStateMachine *this_local;
  
  switch(state) {
  case Interpreter:
    this_local = (FunctionExecutionStateMachine *)&this->interpreterLimit;
    break;
  case AutoProfilingInterpreter0:
    this_local = (FunctionExecutionStateMachine *)&this->autoProfilingInterpreter0Limit;
    break;
  case ProfilingInterpreter0:
    this_local = (FunctionExecutionStateMachine *)&this->profilingInterpreter0Limit;
    break;
  case AutoProfilingInterpreter1:
    this_local = (FunctionExecutionStateMachine *)&this->autoProfilingInterpreter1Limit;
    break;
  case SimpleJit:
    this_local = (FunctionExecutionStateMachine *)&this->simpleJitLimit;
    break;
  case ProfilingInterpreter1:
    this_local = (FunctionExecutionStateMachine *)&this->profilingInterpreter1Limit;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x1f8,"(!\"Unexpected ExecutionState for limit\")",
                                "!\"Unexpected ExecutionState for limit\"");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local = (FunctionExecutionStateMachine *)&this->interpreterLimit;
  }
  return (uint16 *)this_local;
}

Assistant:

uint16& FunctionExecutionStateMachine::GetStateLimit(ExecutionState state)
    {
        switch (state)
        {
        case ExecutionState::Interpreter:
            return interpreterLimit;

        case ExecutionState::AutoProfilingInterpreter0:
            return autoProfilingInterpreter0Limit;

        case ExecutionState::AutoProfilingInterpreter1:
            return autoProfilingInterpreter1Limit;

        case ExecutionState::ProfilingInterpreter0:
            return profilingInterpreter0Limit;

        case ExecutionState::ProfilingInterpreter1:
            return profilingInterpreter1Limit;

        case ExecutionState::SimpleJit:
            return simpleJitLimit;

        default:
            Assert(!"Unexpected ExecutionState for limit");
            return interpreterLimit;
        }
    }